

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_InvalidLambdaResultCallThrows_Test::
~SemanticAnalyserTest_InvalidLambdaResultCallThrows_Test
          (SemanticAnalyserTest_InvalidLambdaResultCallThrows_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_InvalidLambdaResultCallThrows_Test
            ((SemanticAnalyserTest_InvalidLambdaResultCallThrows_Test *)0x1e93d8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, InvalidLambdaResultCallThrows)
{
  std::string source = R"SRC(  
  fn main(): f32
  {
    (\(x: f32): function = { ret 12; })(1);
    ret 0;
  }
  )SRC";
  throwTest(source);
}